

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O2

void __thiscall ThreadedTest::RunThreads(ThreadedTest *this)

{
  pointer ptVar1;
  thread *thread;
  pointer ptVar2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int local_64;
  ThreadedTest *local_60;
  type local_58 [2];
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (local_64 = 0;
      ptVar1 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,
      ptVar2 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start, local_64 < this->num_threads_;
      local_64 = local_64 + 1) {
    local_58[0] = 0x31;
    local_58[1] = 0;
    local_60 = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(ThreadedTest::*)(int),ThreadedTest*,int&>
              ((vector<std::thread,std::allocator<std::thread>> *)&local_48,local_58,&local_60,
               &local_64);
  }
  for (; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  return;
}

Assistant:

void RunThreads() {
    std::vector<std::thread> threads;

    for (int i = 0; i < num_threads_; ++i) {
      threads.emplace_back(&ThreadedTest::RunShard, this, i);
    }

    for (std::thread& thread : threads) {
      thread.join();
    }
  }